

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_strnicmp(char *zLeft,char *zRight,int N)

{
  bool bVar1;
  int local_38;
  uchar *b;
  uchar *a;
  int N_local;
  char *zRight_local;
  char *zLeft_local;
  int local_4;
  
  if (zLeft == (char *)0x0) {
    local_4 = 0;
    if (zRight != (char *)0x0) {
      local_4 = -1;
    }
  }
  else {
    b = (uchar *)zRight;
    a = (uchar *)zLeft;
    N_local = N;
    if (zRight == (char *)0x0) {
      local_4 = 1;
    }
    else {
      while( true ) {
        bVar1 = false;
        if ((0 < N_local) && (bVar1 = false, *a != '\0')) {
          bVar1 = ""[*a] == ""[*b];
        }
        if (!bVar1) break;
        a = a + 1;
        b = b + 1;
        N_local = N_local + -1;
      }
      if (N_local + -1 < 0) {
        local_38 = 0;
      }
      else {
        local_38 = (uint)""[*a] - (uint)""[*b];
      }
      local_4 = local_38;
    }
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_strnicmp(const char *zLeft, const char *zRight, int N){
  register unsigned char *a, *b;
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( N-- > 0 && *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return N<0 ? 0 : UpperToLower[*a] - UpperToLower[*b];
}